

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::setType(SPxSolverBase<double> *this,Type tp)

{
  Verbosity VVar1;
  Type in_ESI;
  SPxSolverBase<double> *in_RDI;
  Verbosity old_verbosity;
  _func_ostream_ptr_ostream_ptr *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  Verbosity local_10 [4];
  
  if (in_RDI->theType != in_ESI) {
    in_RDI->theType = in_ESI;
    forceRecompNonbasicValue(in_RDI);
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar1 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar1)) {
      local_10[0] = SPxOut::getVerbosity(in_RDI->spxout);
      local_14 = 5;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_14);
      soplex::operator<<((SPxOut *)in_RDI,(char *)in_stack_ffffffffffffffd8);
      soplex::operator<<((SPxOut *)in_RDI,(char *)in_stack_ffffffffffffffd8);
      soplex::operator<<((SPxOut *)in_RDI,(char *)in_stack_ffffffffffffffd8);
      soplex::operator<<((SPxOut *)in_RDI,in_stack_ffffffffffffffd8);
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_10);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setType(Type tp)
{

   if(theType != tp)
   {
      theType = tp;

      forceRecompNonbasicValue();

      unInit();
#if 0
      else
      {
         if(!matrixIsSetup)
         {
            SPxBasisBase<R>::load(this);
            // SPxBasisBase<R>::load(desc());
            // not needed, because load(this) allready loads descriptor
         }

         factorized = false;
         m_numCycle = 0;
#endif
         SPX_MSG_INFO3((*spxout), (*spxout) << "Switching to "
                       << static_cast<const char*>((tp == LEAVE)
                             ? "leaving" : "entering")
                       << " algorithm" << std::endl;)
      }
   }